

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O0

void __thiscall write_detail::operator()(write_detail *this,detail_object *detail,xr_writer *w)

{
  xr_writer *w_local;
  detail_object *detail_local;
  write_detail *this_local;
  
  xray_re::xr_writer::w_chunk<unsigned_int>(w,0x1000,&xray_re::DETOBJ_VERSION);
  xray_re::xr_writer::w_chunk(w,0x101,&detail->reference);
  xray_re::xr_writer::open_chunk(w,0x102);
  xray_re::xr_writer::w_float(w,detail->min_scale);
  xray_re::xr_writer::w_float(w,detail->max_scale);
  xray_re::xr_writer::close_chunk(w);
  xray_re::xr_writer::w_chunk<float>(w,0x103,&detail->density);
  xray_re::xr_writer::w_chunk<unsigned_int>(w,0x104,&detail->flags);
  return;
}

Assistant:

void operator()(const detail_object* detail, xr_writer& w) const {
	w.w_chunk(DETOBJ_CHUNK_VERSION, DETOBJ_VERSION);
	w.w_chunk(DETOBJ_CHUNK_REFERENCE, detail->reference);
	w.open_chunk(DETOBJ_CHUNK_SCALE_LIMITS);
	w.w_float(detail->min_scale);
	w.w_float(detail->max_scale);
	w.close_chunk();
	w.w_chunk(DETOBJ_CHUNK_DENSITY, detail->density);
	w.w_chunk(DETOBJ_CHUNK_FLAGS, detail->flags);
}